

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void av1_build_wedge_inter_predictor_from_buf
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane_from,int plane_to,uint8_t **ext_dst0,
               int *ext_dst_stride0,uint8_t **ext_dst1,int *ext_dst_stride1)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  DIFFWTD_MASK_TYPE DVar5;
  byte bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  MB_MODE_INFO *pMVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **pp_Var15;
  uint8_t *puVar16;
  uint16_t *puVar17;
  int *piVar18;
  undefined7 in_register_00000031;
  uint16_t *puVar19;
  long lVar20;
  uint8_t *local_88;
  
  lVar20 = (long)plane_from;
  piVar18 = &xd->plane[lVar20].dst.stride;
  do {
    if (plane_to < lVar20) {
      return;
    }
    BVar1 = av1_ss_size_lookup[CONCAT71(in_register_00000031,bsize) & 0xffffffff][piVar18[-9]]
            [piVar18[-8]];
    bVar2 = block_size_wide[BVar1];
    bVar3 = block_size_high[BVar1];
    puVar19 = (uint16_t *)ext_dst0[lVar20];
    uVar7 = ext_dst_stride0[lVar20];
    local_88 = ext_dst1[lVar20];
    uVar8 = ext_dst_stride1[lVar20];
    pMVar11 = *xd->mi;
    puVar17 = (uint16_t *)((buf_2d *)(piVar18 + -6))->buf;
    puVar16 = xd->seg_mask;
    (pMVar11->interinter_comp).seg_mask = puVar16;
    uVar14 = (uint)xd->cur_buf->flags >> 3;
    iVar12 = (int)bVar3;
    iVar13 = (int)bVar2;
    if ((pMVar11->ref_frame[1] < '\x01') ||
       (bVar4 = (pMVar11->interinter_comp).type, (bVar4 & 0xfe) != 2)) {
      if ((uVar14 & 1) == 0) {
        uVar8 = *piVar18;
        pp_Var15 = &aom_convolve_copy;
      }
      else {
        puVar19 = (uint16_t *)((long)puVar19 * 2);
        puVar17 = (uint16_t *)((long)puVar17 * 2);
        uVar8 = *piVar18;
        pp_Var15 = (_func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **)
                   &aom_highbd_convolve_copy;
      }
      (**pp_Var15)(puVar19,(long)(int)uVar7,puVar17,(long)(int)uVar8,iVar13,iVar12);
    }
    else {
      if ((lVar20 == 0) && (bVar4 == 3)) {
        DVar5 = (pMVar11->interinter_comp).mask_type;
        if ((uVar14 & 1) != 0) {
          (*av1_build_compound_diffwtd_mask_highbd)
                    (puVar16,DVar5,(uint8_t *)((ulong)puVar19 >> 1),uVar7,
                     (uint8_t *)((ulong)local_88 >> 1),uVar8,iVar12,iVar13,xd->bd);
LAB_002062c5:
          local_88 = (uint8_t *)((ulong)local_88 >> 1);
          uVar9 = *piVar18;
          BVar1 = pMVar11->bsize;
          bVar4 = ""[BVar1];
          bVar6 = ""[BVar1];
          iVar10 = xd->bd;
          puVar16 = av1_get_compound_type_mask(&pMVar11->interinter_comp,BVar1);
          (*aom_highbd_blend_a64_mask)
                    ((uint8_t *)puVar17,uVar9,(uint8_t *)((ulong)puVar19 >> 1),uVar7,local_88,uVar8,
                     puVar16,(uint32_t)block_size_wide[BVar1],iVar13,iVar12,
                     SUB14(2 << (bVar6 & 0x1f) == (uint)bVar2,0),
                     SUB14(2 << (bVar4 & 0x1f) == (uint)bVar3,0),iVar10);
          goto LAB_002061b3;
        }
        (*av1_build_compound_diffwtd_mask)
                  (puVar16,DVar5,(uint8_t *)puVar19,uVar7,local_88,uVar8,iVar12,iVar13);
      }
      else if ((uVar14 & 1) != 0) goto LAB_002062c5;
      BVar1 = pMVar11->bsize;
      bVar4 = ""[BVar1];
      bVar6 = ""[BVar1];
      uVar9 = *piVar18;
      puVar16 = av1_get_compound_type_mask(&pMVar11->interinter_comp,BVar1);
      (*aom_blend_a64_mask)
                ((uint8_t *)puVar17,uVar9,(uint8_t *)puVar19,uVar7,local_88,uVar8,puVar16,
                 (uint32_t)block_size_wide[BVar1],iVar13,iVar12,
                 SUB14(2 << (bVar6 & 0x1f) == (uint)bVar2,0),
                 SUB14(2 << (bVar4 & 0x1f) == (uint)bVar3,0));
    }
LAB_002061b3:
    lVar20 = lVar20 + 1;
    piVar18 = piVar18 + 0x28c;
  } while( true );
}

Assistant:

void av1_build_wedge_inter_predictor_from_buf(MACROBLOCKD *xd, BLOCK_SIZE bsize,
                                              int plane_from, int plane_to,
                                              uint8_t *ext_dst0[],
                                              int ext_dst_stride0[],
                                              uint8_t *ext_dst1[],
                                              int ext_dst_stride1[]) {
  int plane;
  assert(bsize < BLOCK_SIZES_ALL);
  for (plane = plane_from; plane <= plane_to; ++plane) {
    const BLOCK_SIZE plane_bsize = get_plane_block_size(
        bsize, xd->plane[plane].subsampling_x, xd->plane[plane].subsampling_y);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];
    build_wedge_inter_predictor_from_buf(
        xd, plane, 0, 0, bw, bh, ext_dst0[plane], ext_dst_stride0[plane],
        ext_dst1[plane], ext_dst_stride1[plane]);
  }
}